

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsd.c
# Opt level: O0

tsd_t * malloc_tsd_boot0(void)

{
  _Bool _Var1;
  int iVar2;
  long *in_FS_OFFSET;
  tsd_t *tsd;
  uint8_t state;
  tsd_t *tsd_1;
  malloc_mutex_lock_order_t in_stack_ffffffffffffff98;
  witness_rank_t in_stack_ffffffffffffff9c;
  undefined1 minimal;
  tsd_t *in_stack_ffffffffffffffa0;
  malloc_mutex_t *in_stack_ffffffffffffffa8;
  tsd_t *local_28;
  
  ncleanups = 0;
  _Var1 = malloc_mutex_init(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffffa0,
                            in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98);
  minimal = (undefined1)(in_stack_ffffffffffffff9c >> 0x18);
  if (_Var1) {
    local_28 = (tsd_t *)0x0;
  }
  else {
    iVar2 = pthread_key_create(&tsd_tsd,tsd_cleanup);
    if (iVar2 == 0) {
      tsd_booted = true;
      local_28 = (tsd_t *)*in_FS_OFFSET;
      if ((local_28->state).repr != '\0') {
        local_28 = tsd_fetch_slow(in_stack_ffffffffffffffa0,(_Bool)minimal);
      }
      local_28->cant_access_tsd_items_directly_use_a_getter_or_setter_arenas_tdata_bypass = true;
    }
    else {
      local_28 = (tsd_t *)0x0;
    }
  }
  return local_28;
}

Assistant:

tsd_t *
malloc_tsd_boot0(void) {
	tsd_t *tsd;

	ncleanups = 0;
	if (malloc_mutex_init(&tsd_nominal_tsds_lock, "tsd_nominal_tsds_lock",
	    WITNESS_RANK_OMIT, malloc_mutex_rank_exclusive)) {
		return NULL;
	}
	if (tsd_boot0()) {
		return NULL;
	}
	tsd = tsd_fetch();
	*tsd_arenas_tdata_bypassp_get(tsd) = true;
	return tsd;
}